

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.c
# Opt level: O0

int sais_main(void *T,int *SA,int *LCP,int fs,int n,int k,int cs,int isbwt,int level0)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint local_12c;
  uint local_128;
  uint local_124;
  uint local_120;
  int local_114;
  uint local_110;
  int local_104;
  uint local_100;
  uint local_f0;
  uint local_e8;
  uint local_e0;
  uint local_d8;
  uint local_d4;
  uint local_c8;
  uint local_c0;
  uint local_b8;
  uint local_b0;
  uint local_a8;
  int twoj;
  uint flags;
  int c1;
  int c0;
  int newfs;
  int pidx;
  int name;
  int t;
  int q;
  int p;
  int m;
  int j;
  int i;
  int *b;
  int *DELTA;
  int *PHI;
  int *PLCP;
  int *RA;
  int *D;
  int *B;
  int *C;
  int local_30;
  int k_local;
  int n_local;
  int fs_local;
  int *LCP_local;
  int *SA_local;
  void *T_local;
  
  c0 = 0;
  C._4_4_ = k;
  local_30 = n;
  k_local = fs;
  _n_local = LCP;
  LCP_local = SA;
  SA_local = (int *)T;
  if ((T == (void *)0x0) || (SA == (int *)0x0)) {
    __assert_fail("(T != NULL) && (SA != NULL)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                  ,0x236,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
  }
  if (((fs < 0) || (n < 1)) || (k < 1)) {
    __assert_fail("(0 <= fs) && (0 < n) && (1 <= k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                  ,0x237,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
  }
  if (k < 0x101) {
    B = (int *)malloc((long)k << 2);
    if (B == (int *)0x0) {
      return -2;
    }
    if (k_local < C._4_4_) {
      D = (int *)malloc((long)C._4_4_ << 2);
      if (D == (int *)0x0) {
        free(B);
        return -2;
      }
      local_a8 = 3;
    }
    else {
      D = LCP_local + ((local_30 + k_local) - C._4_4_);
      local_a8 = 1;
    }
  }
  else if (fs < k) {
    B = (int *)malloc((long)k << 2);
    if (B == (int *)0x0) {
      return -2;
    }
    local_a8 = 0xc;
    D = B;
  }
  else {
    B = SA + ((n + fs) - k);
    if (fs - k < k) {
      if (k < 0x401) {
        D = (int *)malloc((long)k << 2);
        if (D == (int *)0x0) {
          return -2;
        }
        local_a8 = 2;
      }
      else {
        local_a8 = 8;
        D = B;
      }
    }
    else {
      local_a8 = 0;
      D = B + -(long)k;
    }
  }
  if ((local_30 < 0x40000000) && (1 < local_30 / C._4_4_)) {
    if ((local_a8 & 1) == 0) {
      if ((local_a8 == 0) && (C._4_4_ * 2 <= k_local + C._4_4_ * -2)) {
        local_a8 = 0x20;
      }
    }
    else {
      uVar4 = 0x10;
      if (C._4_4_ * 2 <= k_local - C._4_4_) {
        uVar4 = 0x20;
      }
      local_a8 = uVar4 | local_a8;
    }
  }
  getCounts(SA_local,B,local_30,C._4_4_,cs);
  getBuckets(B,D,C._4_4_,1);
  for (m = 0; m < local_30; m = m + 1) {
    LCP_local[m] = 0;
  }
  _j = &pidx;
  m = local_30 + -1;
  p = local_30;
  q = 0;
  if (cs == 4) {
    local_b0 = SA_local[local_30 + -1];
  }
  else {
    local_b0 = (uint)*(byte *)((long)SA_local + (long)(local_30 + -1));
  }
  flags = local_b0;
  do {
    uVar4 = flags;
    m = m + -1;
    bVar1 = false;
    if (-1 < m) {
      if (cs == 4) {
        local_b8 = SA_local[m];
      }
      else {
        local_b8 = (uint)*(byte *)((long)SA_local + (long)m);
      }
      flags = local_b8;
      bVar1 = (int)uVar4 <= (int)local_b8;
    }
  } while (bVar1);
  while (-1 < m) {
    do {
      uVar4 = flags;
      m = m - 1;
      bVar1 = false;
      if (-1 < m) {
        if (cs == 4) {
          local_c0 = SA_local[m];
        }
        else {
          local_c0 = (uint)*(byte *)((long)SA_local + (long)m);
        }
        flags = local_c0;
        bVar1 = (int)local_c0 <= (int)uVar4;
      }
    } while (bVar1);
    if ((uint)m < 0x80000000) {
      *_j = p;
      iVar3 = D[(int)uVar4];
      D[(int)uVar4] = iVar3 + -1;
      _j = LCP_local + (iVar3 + -1);
      p = m;
      q = q + 1;
      do {
        uVar4 = flags;
        m = m + -1;
        bVar1 = false;
        if (-1 < m) {
          if (cs == 4) {
            local_c8 = SA_local[m];
          }
          else {
            local_c8 = (uint)*(byte *)((long)SA_local + (long)m);
          }
          flags = local_c8;
          bVar1 = (int)uVar4 <= (int)local_c8;
        }
      } while (bVar1);
    }
  }
  if (q < 2) {
    if (q == 1) {
      *_j = p + 1;
      if (level0 != 0) {
        _n_local[(long)_j - (long)LCP_local >> 2] = -1;
      }
      newfs = 1;
    }
    else {
      newfs = 0;
    }
  }
  else if ((local_a8 & 0x30) == 0) {
    LMSsort1(SA_local,LCP_local,B,D,local_30,C._4_4_,cs);
    newfs = LMSpostproc1(SA_local,LCP_local,local_30,q,cs);
  }
  else {
    if ((local_a8 & 0x10) == 0) {
      RA = D + -(long)(C._4_4_ << 1);
    }
    else {
      RA = (int *)malloc((long)(C._4_4_ << 1) << 2);
      if (RA == (int *)0x0) {
        if ((local_a8 & 5) != 0) {
          free(B);
        }
        if ((local_a8 & 2) != 0) {
          free(D);
        }
        return -2;
      }
    }
    if (local_30 <= p + 1) {
      __assert_fail("(j + 1) < n",
                    "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                    ,0x272,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)"
                   );
    }
    if (cs == 4) {
      local_d4 = SA_local[p + 1];
    }
    else {
      local_d4 = (uint)*(byte *)((long)SA_local + (long)(p + 1));
    }
    D[(int)local_d4] = D[(int)local_d4] + 1;
    p = 0;
    for (m = 0; m < C._4_4_; m = m + 1) {
      p = B[m] + p;
      if (D[m] != p) {
        if (LCP_local[D[m]] == 0) {
          __assert_fail("SA[B[i]] != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                        ,0x276,
                        "int sais_main(const void *, int *, int *, int, int, int, int, int, int)");
        }
        LCP_local[D[m]] = local_30 + LCP_local[D[m]];
      }
      RA[m + C._4_4_] = 0;
      RA[m] = 0;
    }
    LMSsort2(SA_local,LCP_local,B,D,RA,local_30,C._4_4_,cs);
    newfs = LMSpostproc2(LCP_local,local_30,q);
    if ((local_a8 & 0x10) != 0) {
      free(RA);
    }
  }
  if (newfs < q) {
    if ((local_a8 & 4) != 0) {
      free(B);
    }
    if ((local_a8 & 2) != 0) {
      free(D);
    }
    c1 = local_30 + k_local + q * -2;
    if ((local_a8 & 0xd) == 0) {
      if (c1 < C._4_4_ + newfs) {
        local_a8 = local_a8 | 8;
      }
      else {
        c1 = c1 - C._4_4_;
      }
    }
    if (c1 + q < local_30 >> 1) {
      __assert_fail("(n >> 1) <= (newfs + m)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jeffdaily[P]parasail/contrib/sais-lite-lcp/sais.c"
                    ,0x292,"int sais_main(const void *, int *, int *, int, int, int, int, int, int)"
                   );
    }
    PLCP = LCP_local + (long)q + (long)c1;
    m = q + (local_30 >> 1);
    p = q + -1;
    while (m = m + -1, q <= m) {
      if (LCP_local[m] != 0) {
        PLCP[p] = LCP_local[m] + -1;
        p = p + -1;
      }
    }
    iVar3 = sais_main(PLCP,LCP_local,(int *)0x0,c1,q,newfs,4,0,0);
    if (iVar3 != 0) {
      if ((local_a8 & 1) != 0) {
        free(B);
      }
      return -2;
    }
    m = local_30 + -1;
    if (cs == 4) {
      local_d8 = SA_local[local_30 + -1];
    }
    else {
      local_d8 = (uint)*(byte *)((long)SA_local + (long)(local_30 + -1));
    }
    flags = local_d8;
    do {
      uVar4 = flags;
      m = m + -1;
      bVar1 = false;
      if (-1 < m) {
        if (cs == 4) {
          local_e0 = SA_local[m];
        }
        else {
          local_e0 = (uint)*(byte *)((long)SA_local + (long)m);
        }
        flags = local_e0;
        bVar1 = (int)uVar4 <= (int)local_e0;
      }
      p = q + -1;
      uVar4 = m;
    } while (bVar1);
    while (m = uVar4, uVar4 = m, -1 < m) {
      do {
        m = uVar4;
        uVar2 = flags;
        uVar4 = m - 1;
        bVar1 = false;
        if (-1 < (int)uVar4) {
          if (cs == 4) {
            local_e8 = SA_local[(int)uVar4];
          }
          else {
            local_e8 = (uint)*(byte *)((long)SA_local + (long)(int)uVar4);
          }
          flags = local_e8;
          bVar1 = (int)local_e8 <= (int)uVar2;
        }
      } while (bVar1);
      if (uVar4 < 0x80000000) {
        iVar3 = p + -1;
        PLCP[p] = m;
        m = uVar4;
        do {
          uVar4 = flags;
          m = m + -1;
          bVar1 = false;
          if (-1 < m) {
            if (cs == 4) {
              local_f0 = SA_local[m];
            }
            else {
              local_f0 = (uint)*(byte *)((long)SA_local + (long)m);
            }
            flags = local_f0;
            bVar1 = (int)uVar4 <= (int)local_f0;
          }
          p = iVar3;
          uVar4 = m;
        } while (bVar1);
      }
    }
    if (level0 != 0) {
      if (q < local_30 / 3) {
        DELTA = _n_local + q;
        PLCP[q] = local_30;
        p = *LCP_local;
        DELTA[p << 1] = local_30 + -1;
        DELTA[p * 2 + 1] = 0;
        for (m = 1; m < q; m = m + 1) {
          name = LCP_local[m];
          DELTA[name * 2] = PLCP[p];
          DELTA[name * 2 + 1] = PLCP[p + 1] - PLCP[p];
          p = name;
        }
        t = 0;
        p = 0;
        for (m = 0; m < local_30; m = m + 1) {
          if (m == PLCP[p]) {
            iVar3 = p * 2;
            if (t < 0) {
              t = 0;
            }
            while( true ) {
              if (cs == 4) {
                uVar4 = SA_local[m + t];
                local_100 = SA_local[DELTA[iVar3] + t];
              }
              else {
                uVar4 = (uint)*(byte *)((long)SA_local + (long)(m + t));
                local_100 = (uint)*(byte *)((long)SA_local + (long)(DELTA[iVar3] + t));
              }
              if (uVar4 != local_100) break;
              t = t + 1;
            }
            pidx = DELTA[iVar3 + 1];
            name = PLCP[p + 1] - PLCP[p];
            DELTA[iVar3] = t;
            p = p + 1;
            local_104 = name;
            if (name < pidx) {
              local_104 = pidx;
            }
            t = t - local_104;
          }
        }
        for (p = 0; PHI = DELTA, p < q; p = p + 1) {
          _n_local[p] = DELTA[LCP_local[p] << 1];
        }
      }
      else {
        DELTA = _n_local;
        b = _n_local + q;
        PLCP[q] = local_30;
        p = *LCP_local;
        _n_local[p] = local_30 + -1;
        b[p] = 0;
        for (m = 1; m < q; m = m + 1) {
          name = LCP_local[m];
          _n_local[name] = PLCP[p];
          b[name] = PLCP[p + 1] - PLCP[p];
          p = name;
        }
        t = 0;
        p = 0;
        for (m = 0; m < local_30; m = m + 1) {
          if (m == PLCP[p]) {
            if (t < 0) {
              t = 0;
            }
            while( true ) {
              if (cs == 4) {
                uVar4 = SA_local[m + t];
                local_110 = SA_local[_n_local[p] + t];
              }
              else {
                uVar4 = (uint)*(byte *)((long)SA_local + (long)(m + t));
                local_110 = (uint)*(byte *)((long)SA_local + (long)(_n_local[p] + t));
              }
              if (uVar4 != local_110) break;
              t = t + 1;
            }
            pidx = b[p];
            name = PLCP[p + 1] - PLCP[p];
            b[p] = t;
            local_114 = name;
            if (name < pidx) {
              local_114 = pidx;
            }
            t = t - local_114;
            p = p + 1;
          }
        }
        for (p = 0; PHI = b, p < q; p = p + 1) {
          _n_local[p] = b[LCP_local[p]];
        }
      }
    }
    for (m = 0; m < q; m = m + 1) {
      LCP_local[m] = PLCP[LCP_local[m]];
    }
    if (((local_a8 & 4) != 0) && (D = (int *)malloc((long)C._4_4_ << 2), B = D, D == (int *)0x0)) {
      return -2;
    }
    if (((local_a8 & 2) != 0) && (D = (int *)malloc((long)C._4_4_ << 2), D == (int *)0x0)) {
      if ((local_a8 & 1) != 0) {
        free(B);
      }
      return -2;
    }
  }
  else if (level0 != 0) {
    p = *LCP_local;
    for (m = 1; m < q; m = m + 1) {
      t = 0;
      while( true ) {
        if (cs == 4) {
          uVar4 = SA_local[LCP_local[m] + t];
          local_120 = SA_local[p + t];
        }
        else {
          uVar4 = (uint)*(byte *)((long)SA_local + (long)(LCP_local[m] + t));
          local_120 = (uint)*(byte *)((long)SA_local + (long)(p + t));
        }
        if (uVar4 != local_120) break;
        t = t + 1;
      }
      _n_local[m] = t;
      p = LCP_local[m];
    }
  }
  if ((local_a8 & 8) != 0) {
    getCounts(SA_local,B,local_30,C._4_4_,cs);
  }
  if (1 < q) {
    getBuckets(B,D,C._4_4_,1);
    m = q + -1;
    p = local_30;
    t = LCP_local[q + -1];
    if (cs == 4) {
      local_124 = SA_local[t];
    }
    else {
      local_124 = (uint)*(byte *)((long)SA_local + (long)t);
    }
    twoj = local_124;
    if (level0 == 0) {
      do {
        iVar3 = twoj;
        name = D[twoj];
        while (name < p) {
          p = p + -1;
          LCP_local[p] = 0;
        }
        do {
          p = p + -1;
          LCP_local[p] = t;
          m = m + -1;
          if (m < 0) break;
          t = LCP_local[m];
          if (cs == 4) {
            local_12c = SA_local[t];
          }
          else {
            local_12c = (uint)*(byte *)((long)SA_local + (long)t);
          }
          twoj = local_12c;
        } while (local_12c == iVar3);
      } while (-1 < m);
      while (0 < p) {
        p = p + -1;
        LCP_local[p] = 0;
      }
    }
    else {
      c1 = _n_local[q + -1];
      do {
        iVar3 = twoj;
        name = D[twoj];
        while (name < p) {
          p = p + -1;
          LCP_local[p] = 0;
          _n_local[p] = -2;
        }
        do {
          p = p + -1;
          LCP_local[p] = t;
          _n_local[p] = c1;
          m = m + -1;
          if (m < 0) break;
          c1 = _n_local[m];
          t = LCP_local[m];
          if (cs == 4) {
            local_128 = SA_local[t];
          }
          else {
            local_128 = (uint)*(byte *)((long)SA_local + (long)t);
          }
          twoj = local_128;
        } while (local_128 == iVar3);
        _n_local[p] = -1;
      } while (-1 < m);
      while (0 < p) {
        p = p + -1;
        LCP_local[p] = 0;
        _n_local[p] = -2;
      }
    }
  }
  if (isbwt == 0) {
    if (level0 == 0) {
      induceSA(SA_local,LCP_local,B,D,local_30,C._4_4_,cs);
    }
    else {
      induceSAandLCP(SA_local,LCP_local,_n_local,B,D,local_30,C._4_4_,cs);
    }
  }
  else {
    c0 = computeBWT(SA_local,LCP_local,B,D,local_30,C._4_4_,cs);
  }
  if ((local_a8 & 5) != 0) {
    free(B);
  }
  if ((local_a8 & 2) != 0) {
    free(D);
  }
  return c0;
}

Assistant:

static sais_index_type sais_main(const void *T, sais_index_type *SA,
				 sais_index_type *LCP,
				 sais_index_type fs, sais_index_type n, sais_index_type k, int cs,
				 sais_bool_type isbwt,
				 sais_bool_type level0) { /* level0 = 1 iff recursion depth is 0 */
  sais_index_type *C, *B, *D, *RA, *PLCP, *PHI, *DELTA, *b;
  sais_index_type i, j, m, /* m: number of S*-suffixes */
    p, q, t, name, pidx = 0, newfs;
  sais_index_type c0, c1;
  unsigned int flags;

  assert((T != NULL) && (SA != NULL));
  assert((0 <= fs) && (0 < n) && (1 <= k));

  if(k <= MINBUCKETSIZE) {
    if((C = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
    if(k <= fs) {
      B = SA + (n + fs - k);
      flags = 1;
    } else {
      if((B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { SAIS_MYFREE(C, k, sais_index_type); return -2; }
      flags = 3;
    }
  } else if(k <= fs) {
    C = SA + (n + fs - k);
    if(k <= (fs - k)) {
      B = C - k;
      flags = 0;
    } else if(k <= (MINBUCKETSIZE * 4)) {
      if((B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
      flags = 2;
    } else {
      B = C;
      flags = 8;
    }
  } else {
    if((C = B = SAIS_MYMALLOC(k, sais_index_type)) == NULL) { return -2; }
    flags = 4 | 8;
  }
  if((n <= SAIS_LMSSORT2_LIMIT) && (2 <= (n / k))) {
    if(flags & 1) { flags |= ((k * 2) <= (fs - k)) ? 32 : 16; }
    else if((flags == 0) && ((k * 2) <= (fs - k * 2))) { flags |= 32; }
  }

  /* stage 1: reduce the problem by at least 1/2
     sort all the LMS-substrings */
  getCounts(T, C, n, k, cs); getBuckets(C, B, k, 1); /* find ends of buckets */

  for(i = 0; i < n; ++i) { SA[i] = 0; }
  b = &t; i = n - 1; j = n; m = 0; c0 = chr(n - 1);
  do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
  for(; 0 <= i;) {
    do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) <= c1));
    if(0 <= i) {
      *b = j;
      b = SA + --B[c1]; j = i; ++m;
      do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
    }
  }

  if(1 < m) {
    if(flags & (16 | 32)) {
      if(flags & 16) {
        if((D = SAIS_MYMALLOC(k * 2, sais_index_type)) == NULL) {
          if(flags & (1 | 4)) { SAIS_MYFREE(C, k, sais_index_type); }
          if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }
          return -2;
        }
      } else {
        D = B - k * 2;
      }
      assert((j + 1) < n);
      ++B[chr(j + 1)];
      for(i = 0, j = 0; i < k; ++i) {
        j += C[i];
        if(B[i] != j) { assert(SA[B[i]] != 0); SA[B[i]] += n; }
        D[i] = D[i + k] = 0;
      }
      LMSsort2(T, SA, C, B, D, n, k, cs);
      name = LMSpostproc2(SA, n, m);
      if(flags & 16) { SAIS_MYFREE(D, k * 2, sais_index_type); }
    } else {
      LMSsort1(T, SA, C, B, n, k, cs);
      name = LMSpostproc1(T, SA, n, m, cs);
    }
  } else if (m == 1) { /* only one S*-suffix => set immediately */
    *b = j + 1;        /* set entry in SA */
    if (level0) { LCP[b-SA] = -1; } /* mark first (=only) S*-suffix in bucket */
    name = 1;
  } else {
    name = 0;
  }

  /* stage 2: solve the reduced problem
     recurse if names are not yet unique */
  if(name < m) {
    if(flags & 4) { SAIS_MYFREE(C, k, sais_index_type); }
    if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }
    newfs = (n + fs) - (m * 2);
    if((flags & (1 | 4 | 8)) == 0) {
      if((k + name) <= newfs) { newfs -= k; }
      else { flags |= 8; }
    }
    assert((n >> 1) <= (newfs + m));
    RA = SA + m + newfs;
    for(i = m + (n >> 1) - 1, j = m - 1; m <= i; --i) {
      if(SA[i] != 0) {
        RA[j--] = SA[i] - 1;
      }
    }
    
    if(sais_main(RA, SA, NULL, newfs, m, name, sizeof(sais_index_type), 0, 0) != 0) {
      if(flags & 1) { SAIS_MYFREE(C, k, sais_index_type); }
      return -2;
    }

    /* (re)compute starting positions of S*-suffixes (stored in RA): */
    i = n - 1; j = m - 1; c0 = chr(n - 1);
    do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
    for(; 0 <= i;) {
      do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) <= c1));
      if(0 <= i) {
        RA[j--] = i + 1;
        do { c1 = c0; } while((0 <= --i) && ((c0 = chr(i)) >= c1));
      }
    }

    /* construct LCP for S*-suffixes: */
    /* PHI: "to whom I want to be compared" (pos. in T) */
    /* DELTA: "distance (in T) to next S*" (in PHI-order) */
    if (level0) {
      if (m < n/3) { /* hence we can store PHI and DELTA interleaved */
	PHI = LCP+m;       /* use space in LCP-array for PHI and DELTA */
	RA[m] = n;         /* stopper */
	j = SA[0];         /* j stores SA[i-1] in the following loop */
	PHI[j<<1] = n-1;   /* set PHI[SA[0]] to $ (causes mismatch in char. comp.) */
	PHI[(j<<1)+1] = 0; /* set DELTA */
	for (i = 1; i < m; ++i) {
	  q = SA[i];                /* text position */
	  p = q<<1;                 /* for interleaving */
	  PHI[p]=RA[j];             /* set PHI-array */
	  PHI[p+1]=RA[j+1]-RA[j];   /* set DELTA */
	  j = q;                    /* store for next loop iteration */
	}

	PLCP = PHI; /* overwrite DELTA in following loop */
	p = 0; /* guaranteed LCP-value */
	j = 0; /* position in PLCP and RA */
	for (i = 0; i < n; ++i) {
	  if (i == RA[j]) {
	    sais_index_type twoj = j << 1;
	    if (p < 0) p = 0;
	    while (chr(i+p) == chr(PHI[twoj]+p)) ++p;
	    t = PHI[twoj+1];      /* accesses DELTA-value */
	    q = RA[j+1]-RA[j];    /* length difference */
	    PLCP[twoj] = p;       /* overwrite PHI with PLCP */
	    ++j;
	    p -= (t > q) ? t : q; /* decrease p by larger of t and q */
	  }
	}

	/* translate PLCP-values to SA-order: */
	for (j = 0; j < m; ++j) LCP[j] = PLCP[SA[j]<<1];
      }
      else { /* non-interleaved */
	PHI = LCP;     /* use space in LCP-array for PHI */
	DELTA = LCP+m; /* because we compute only m < n/2 values, this is valid */
	RA[m] = n;     /* stopper */
	j = SA[0];     /* j stores SA[i-1] in the following loop */
	PHI[j] = n-1;  /* set PHI[SA[0]] to $ (causes mismatch in char. comp.) */
	DELTA[j] = 0;
	for (i = 1; i < m; ++i) {
	  q = SA[i];              /* text position */
	  PHI[q]=RA[j];           /* set PHI-array */
	  DELTA[q]=RA[j+1]-RA[j]; /* set DELTA */
	  j = q;                  /* store for next loop iteration */
	}

	PLCP = DELTA; /* overwrite DELTA in following loop */
	p = 0; /* guaranteed LCP-value */
	j = 0; /* position in PLCP and RA */
	for (i = 0; i < n; ++i) {
	  if (i == RA[j]) {
	    if (p < 0) p = 0;
	    while (chr(i+p) == chr(PHI[j]+p)) ++p;
	    t = PLCP[j];          /* accesses DELTA-value */
	    q = RA[j+1]-RA[j];    /* length difference */
	    PLCP[j++] = p;
	    p -= (t > q) ? t : q; /* decrease p by larger of t and q */
	  }
	}

	/* translate PLCP-values to SA-order: */
	for (j = 0; j < m; ++j) LCP[j] = PLCP[SA[j]];
      }
    }

    /* translate indices in RA to indices in T: */
    for(i = 0; i < m; ++i) SA[i] = RA[SA[i]];

    if(flags & 4) {
      if((C = B = SAIS_MYMALLOC(k, int)) == NULL) { return -2; }
    }
    if(flags & 2) {
      if((B = SAIS_MYMALLOC(k, int)) == NULL) {
        if(flags & 1) { SAIS_MYFREE(C, k, sais_index_type); }
        return -2;
      }
    }
  } /* endif (name < m) */
  else if (level0) { /* this should only occur for small or pathetic inputs */
    /* all names unique => computing LCP for *S naively takes linear time */
    /*printf("*** computing LCP naively..."); */
    j = SA[0]; /* j = SA[i-1] in the following loop */
    for (i = 1; i < m; ++i) {
      p = 0;
      while (chr(SA[i]+p) == chr(j+p)) p++;
      LCP[i] = p;
      j = SA[i];
    }
    /*printf("done.\n"); */
  }

  /* stage 3: induce the result for the original problem */
  if(flags & 8) { getCounts(T, C, n, k, cs); }
  /* put all S*-suffixes (and their LCP-values) into their buckets */
  if(1 < m) { /* otherwise SA (and LCP) is already correct */
    getBuckets(C, B, k, 1); /* find ends of buckets */
    i = m - 1, j = n, p = SA[m - 1], c1 = chr(p);
    if (level0) {
      newfs = LCP[m-1]; /* newfs stores LCP[i] in the following loop */
      do {
	q = B[c0 = c1];
	while(q < j) {
	  SA[--j] = 0; LCP[j] = -2; /* set remaining entries in old bucket to 0/-2 */
	}
	
	do { /* step through bucket c0 and write S*-suffixes to SA: */
	  SA[--j] = p; LCP[j] = newfs;
	  if(--i < 0) break;
	  newfs = LCP[i]; p = SA[i];
	} while((c1 = chr(p)) == c0);
	/*assert(LCP[j]==0); *//* first S*-suffix in bucket must have LCP-value 0 */
	LCP[j] = -1;       /* mark first S*-suffix in every bucket */
      } while(0 <= i);
      while(0 < j) {
	SA[--j] = 0; LCP[j] = -2; /* set remaining entries in smallest buckets to 0/-2 */
      }
    }
    else {
      do {
	q = B[c0 = c1];
	while(q < j) SA[--j] = 0; /* set remaining entries in old bucket to 0 */
	do { /* step through bucket c0 */
	  SA[--j] = p;
	  if(--i < 0) break;
	  p = SA[i];
	} while((c1 = chr(p)) == c0);
      } while(0 <= i);
      while(0 < j) SA[--j] = 0; /* set remaining entries in 1st bucket to 0 */
    }
  }

  if(isbwt == 0) {
    if (level0) induceSAandLCP(T, SA, LCP, C, B, n, k, cs);
    else induceSA(T, SA, C, B, n, k, cs);
  }
  else { pidx = computeBWT(T, SA, C, B, n, k, cs); }
  if(flags & (1 | 4)) { SAIS_MYFREE(C, k, sais_index_type); }
  if(flags & 2) { SAIS_MYFREE(B, k, sais_index_type); }

  return pidx;
}